

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

int bgzf_getline(BGZF *fp,int delim,kstring_t *str)

{
  void *pvVar1;
  hFILE *phVar2;
  int iVar3;
  char *__ptr;
  int iVar4;
  ulong uVar5;
  long lVar6;
  size_t __n;
  long lVar7;
  size_t __size;
  int iVar8;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  
  pvVar1 = fp->uncompressed_block;
  str->l = 0;
  iVar3 = fp->block_length;
  iVar4 = fp->block_offset;
  do {
    if (iVar3 <= iVar4) {
      iVar3 = bgzf_read_block(fp);
      if (iVar3 == 0) {
        iVar3 = fp->block_length;
        if (iVar3 != 0) {
          iVar4 = fp->block_offset;
          goto LAB_00129e99;
        }
        iVar3 = -1;
      }
      else {
        iVar3 = -2;
      }
      sVar9 = str->l;
      if (sVar9 == 0) {
        return iVar3;
      }
      bVar11 = false;
      goto LAB_00129fab;
    }
LAB_00129e99:
    lVar7 = (long)iVar4;
    lVar10 = (long)iVar3;
    lVar6 = lVar7;
    iVar8 = iVar3;
    if (iVar3 < iVar4) {
      iVar8 = iVar4;
    }
    for (; lVar6 < lVar10; lVar6 = lVar6 + 1) {
      if ((uint)*(byte *)((long)pvVar1 + lVar6) == delim) {
        iVar8 = (int)lVar6;
        break;
      }
    }
    sVar9 = str->l;
    __ptr = str->s;
    __n = (size_t)(iVar8 - iVar4);
    uVar5 = sVar9 + __n + 1;
    if (str->m <= uVar5) {
      uVar5 = uVar5 >> 1 | uVar5;
      uVar5 = uVar5 >> 2 | uVar5;
      uVar5 = uVar5 >> 4 | uVar5;
      uVar5 = uVar5 >> 8 | uVar5;
      __size = (uVar5 >> 0x10 | uVar5) + 1;
      str->m = __size;
      __ptr = (char *)realloc(__ptr,__size);
      str->s = __ptr;
      sVar9 = str->l;
      lVar7 = (long)fp->block_offset;
    }
    memcpy(__ptr + sVar9,(void *)(lVar7 + (long)pvVar1),__n);
    sVar9 = str->l + __n;
    str->l = sVar9;
    iVar3 = fp->block_length;
    iVar4 = fp->block_offset + (iVar8 - iVar4) + 1;
    fp->block_offset = iVar4;
    if (iVar3 <= iVar4) {
      phVar2 = fp->fp;
      fp->block_address = (int64_t)(phVar2->begin + (phVar2->offset - (long)phVar2->buffer));
      fp->block_length = 0;
      fp->block_offset = 0;
      iVar3 = 0;
      iVar4 = 0;
    }
  } while (lVar10 <= lVar6);
  bVar11 = sVar9 == 0;
LAB_00129fab:
  fp->uncompressed_address = fp->uncompressed_address + sVar9;
  if (((delim == 10) && (!bVar11)) && (str->s[sVar9 - 1] == '\r')) {
    sVar9 = sVar9 - 1;
    str->l = sVar9;
  }
  str->s[sVar9] = '\0';
  return (int)str->l;
}

Assistant:

int bgzf_getline(BGZF *fp, int delim, kstring_t *str)
{
    int l, state = 0;
    unsigned char *buf = (unsigned char*)fp->uncompressed_block;
    str->l = 0;
    do {
        if (fp->block_offset >= fp->block_length) {
            if (bgzf_read_block(fp) != 0) { state = -2; break; }
            if (fp->block_length == 0) { state = -1; break; }
        }
        for (l = fp->block_offset; l < fp->block_length && buf[l] != delim; ++l);
        if (l < fp->block_length) state = 1;
        l -= fp->block_offset;
        if (str->l + l + 1 >= str->m) {
            str->m = str->l + l + 2;
            kroundup32(str->m);
            str->s = (char*)realloc(str->s, str->m);
        }
        memcpy(str->s + str->l, buf + fp->block_offset, l);
        str->l += l;
        fp->block_offset += l + 1;
        if (fp->block_offset >= fp->block_length) {
            fp->block_address = htell(fp->fp);
            fp->block_offset = 0;
            fp->block_length = 0;
        }
    } while (state == 0);
    if (str->l == 0 && state < 0) return state;
    fp->uncompressed_address += str->l;
    if ( delim=='\n' && str->l>0 && str->s[str->l-1]=='\r' ) str->l--;
    str->s[str->l] = 0;
    return str->l;
}